

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktQueryPoolOcclusionTests.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::QueryPool::anon_unknown_0::BasicOcclusionQueryTestInstance::iterate
          (TestStatus *__return_storage_ptr__,BasicOcclusionQueryTestInstance *this)

{
  VkAllocationCallbacks **pCreateInfo;
  VkCommandPool *this_00;
  allocator<vk::VkClearValue> *this_01;
  VkCommandBuffer pVVar1;
  VkRenderPass _renderPass;
  VkCommandBuffer_s *pVVar2;
  RefData<vk::VkCommandBuffer_s_*> data;
  VkRect2D _renderArea;
  deUint32 _queueFamilyIndex;
  VkResult result;
  TestContext *this_02;
  TestLog *this_03;
  VkDevice device_00;
  VkQueue pVVar3;
  DeviceInterface *vk_00;
  Handle<(vk::HandleType)24> *pHVar4;
  VkCommandBuffer_s **ppVVar5;
  Image *pIVar6;
  VkImage image;
  reference ptr;
  size_type sVar7;
  Handle<(vk::HandleType)17> *pHVar8;
  Handle<(vk::HandleType)23> *pHVar9;
  Handle<(vk::HandleType)18> *pHVar10;
  Buffer *this_04;
  TestError *this_05;
  MessageBuilder *pMVar11;
  allocator<char> local_7f9;
  string local_7f8;
  undefined4 local_7d8;
  allocator<char> local_7d1;
  string local_7d0;
  MessageBuilder local_7b0;
  MessageBuilder local_630;
  unsigned_long local_4b0;
  deUint64 expectedValue;
  int queryNdx;
  bool passed;
  int local_320;
  allocator<char> local_319;
  int ndx;
  allocator<char> local_2f1;
  string local_2f0;
  LogSection local_2d0;
  deUint64 local_290;
  VkResult local_284;
  undefined8 uStack_280;
  VkResult queryResult;
  size_t queryResultsSize;
  deUint64 queryResults [2];
  Handle<(vk::HandleType)6> local_260;
  undefined8 uStack_258;
  VkSubmitInfo submitInfo;
  undefined8 local_1e8;
  VkDeviceSize vertexBufferOffset;
  VkBuffer vertexBuffer;
  undefined1 local_1a0 [8];
  RenderPassBeginInfo renderPassBegin;
  VkRect2D renderArea;
  undefined1 local_130 [8];
  vector<vk::VkClearValue,_std::allocator<vk::VkClearValue>_> renderPassClearValues;
  undefined1 local_108 [8];
  CmdBufferBeginInfo beginInfo;
  Move<vk::VkCommandBuffer_s_*> local_d0;
  RefData<vk::VkCommandBuffer_s_*> local_b0;
  undefined1 local_90 [8];
  Unique<vk::VkCommandBuffer_s_*> cmdBuffer;
  Move<vk::Handle<(vk::HandleType)24>_> cmdPool;
  CmdPoolCreateInfo cmdPoolCreateInfo;
  DeviceInterface *vk;
  VkQueue queue;
  VkDevice device;
  TestLog *log;
  BasicOcclusionQueryTestInstance *this_local;
  
  this_02 = Context::getTestContext((this->super_TestInstance).m_context);
  this_03 = tcu::TestContext::getLog(this_02);
  device_00 = Context::getDevice((this->super_TestInstance).m_context);
  pVVar3 = Context::getUniversalQueue((this->super_TestInstance).m_context);
  vk_00 = Context::getDeviceInterface((this->super_TestInstance).m_context);
  _queueFamilyIndex = Context::getUniversalQueueFamilyIndex((this->super_TestInstance).m_context);
  pCreateInfo = &cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator;
  Draw::CmdPoolCreateInfo::CmdPoolCreateInfo((CmdPoolCreateInfo *)pCreateInfo,_queueFamilyIndex,2);
  this_00 = &cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool;
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)this_00,vk_00,device_00,
             (VkCommandPoolCreateInfo *)pCreateInfo,(VkAllocationCallbacks *)0x0);
  pHVar4 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)24>_> *)this_00);
  ::vk::allocateCommandBuffer
            (&local_d0,vk_00,device_00,(VkCommandPool)pHVar4->m_internal,
             VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_b0,(Move *)&local_d0);
  data.deleter.m_deviceIface._0_4_ = (int)local_b0.deleter.m_deviceIface;
  data.object = local_b0.object;
  data.deleter.m_deviceIface._4_4_ = (int)((ulong)local_b0.deleter.m_deviceIface >> 0x20);
  data.deleter.m_device._0_4_ = (int)local_b0.deleter.m_device;
  data.deleter.m_device._4_4_ = (int)((ulong)local_b0.deleter.m_device >> 0x20);
  data.deleter.m_pool.m_internal = local_b0.deleter.m_pool.m_internal;
  ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::Unique
            ((Unique<vk::VkCommandBuffer_s_*> *)local_90,data);
  ::vk::refdetails::Move<vk::VkCommandBuffer_s_*>::~Move(&local_d0);
  Draw::CmdBufferBeginInfo::CmdBufferBeginInfo((CmdBufferBeginInfo *)local_108,0);
  ppVVar5 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      ((RefBase<vk::VkCommandBuffer_s_*> *)local_90);
  (*vk_00->_vptr_DeviceInterface[0x49])(vk_00,*ppVVar5,local_108);
  ppVVar5 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      ((RefBase<vk::VkCommandBuffer_s_*> *)local_90);
  pVVar1 = *ppVVar5;
  pIVar6 = de::SharedPtr<vkt::Draw::Image>::operator->
                     (&this->m_stateObjects->m_colorAttachmentImage);
  image = Draw::Image::object(pIVar6);
  Draw::transition2DImage
            (vk_00,pVVar1,image,1,VK_IMAGE_LAYOUT_UNDEFINED,VK_IMAGE_LAYOUT_GENERAL,0,0x100);
  ppVVar5 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      ((RefBase<vk::VkCommandBuffer_s_*> *)local_90);
  pVVar1 = *ppVVar5;
  pIVar6 = de::SharedPtr<vkt::Draw::Image>::operator->(&this->m_stateObjects->m_DepthImage);
  renderPassClearValues.super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)Draw::Image::object(pIVar6);
  Draw::transition2DImage
            (vk_00,pVVar1,
             (VkImage)renderPassClearValues.
                      super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,2,VK_IMAGE_LAYOUT_UNDEFINED,
             VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL,0,0x400);
  this_01 = (allocator<vk::VkClearValue> *)((long)&renderArea.extent.height + 3);
  std::allocator<vk::VkClearValue>::allocator(this_01);
  std::vector<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>::vector
            ((vector<vk::VkClearValue,_std::allocator<vk::VkClearValue>_> *)local_130,2,this_01);
  std::allocator<vk::VkClearValue>::~allocator
            ((allocator<vk::VkClearValue> *)((long)&renderArea.extent.height + 3));
  ptr = std::vector<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>::operator[]
                  ((vector<vk::VkClearValue,_std::allocator<vk::VkClearValue>_> *)local_130,0);
  sVar7 = std::vector<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>::size
                    ((vector<vk::VkClearValue,_std::allocator<vk::VkClearValue>_> *)local_130);
  ::deMemset(ptr,0,(long)(int)sVar7 << 4);
  renderPassBegin.m_clearValues.
  super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  renderArea.offset.x = 0x80;
  renderArea.offset.y = 0x80;
  pHVar8 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::operator*
                     (&(this->m_stateObjects->m_renderPass).
                       super_RefBase<vk::Handle<(vk::HandleType)17>_>);
  _renderPass.m_internal = pHVar8->m_internal;
  pHVar9 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::operator*
                     (&(this->m_stateObjects->m_framebuffer).
                       super_RefBase<vk::Handle<(vk::HandleType)23>_>);
  _renderArea.extent.width = renderArea.offset.x;
  _renderArea.extent.height = renderArea.offset.y;
  _renderArea.offset =
       (VkOffset2D)
       renderPassBegin.m_clearValues.
       super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  Draw::RenderPassBeginInfo::RenderPassBeginInfo
            ((RenderPassBeginInfo *)local_1a0,_renderPass,(VkFramebuffer)pHVar9->m_internal,
             _renderArea,(vector<vk::VkClearValue,_std::allocator<vk::VkClearValue>_> *)local_130);
  ppVVar5 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      ((RefBase<vk::VkCommandBuffer_s_*> *)local_90);
  (*vk_00->_vptr_DeviceInterface[0x70])(vk_00,*ppVVar5,(this->m_queryPool).m_internal,0,2);
  ppVVar5 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      ((RefBase<vk::VkCommandBuffer_s_*> *)local_90);
  (*vk_00->_vptr_DeviceInterface[0x74])(vk_00,*ppVVar5,local_1a0,0);
  ppVVar5 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      ((RefBase<vk::VkCommandBuffer_s_*> *)local_90);
  pVVar2 = *ppVVar5;
  pHVar10 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::operator*
                      (&(this->m_stateObjects->m_pipeline).
                        super_RefBase<vk::Handle<(vk::HandleType)18>_>);
  vertexBuffer.m_internal = pHVar10->m_internal;
  (*vk_00->_vptr_DeviceInterface[0x4c])(vk_00,pVVar2,0,vertexBuffer.m_internal);
  this_04 = de::SharedPtr<vkt::Draw::Buffer>::operator->(&this->m_stateObjects->m_vertexBuffer);
  vertexBufferOffset = (VkDeviceSize)Draw::Buffer::object(this_04);
  local_1e8 = 0;
  ppVVar5 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      ((RefBase<vk::VkCommandBuffer_s_*> *)local_90);
  (*vk_00->_vptr_DeviceInterface[0x58])(vk_00,*ppVVar5,0,1,&vertexBufferOffset,&local_1e8);
  ppVVar5 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      ((RefBase<vk::VkCommandBuffer_s_*> *)local_90);
  (*vk_00->_vptr_DeviceInterface[0x6e])
            (vk_00,*ppVVar5,(this->m_queryPool).m_internal,0,
             (ulong)(this->m_testVector).queryControlFlags);
  ppVVar5 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      ((RefBase<vk::VkCommandBuffer_s_*> *)local_90);
  (*vk_00->_vptr_DeviceInterface[0x6f])(vk_00,*ppVVar5,(this->m_queryPool).m_internal,0);
  ppVVar5 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      ((RefBase<vk::VkCommandBuffer_s_*> *)local_90);
  (*vk_00->_vptr_DeviceInterface[0x6e])
            (vk_00,*ppVVar5,(this->m_queryPool).m_internal,1,
             (ulong)(this->m_testVector).queryControlFlags);
  ppVVar5 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      ((RefBase<vk::VkCommandBuffer_s_*> *)local_90);
  (*vk_00->_vptr_DeviceInterface[0x59])(vk_00,*ppVVar5,3,1,0);
  ppVVar5 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      ((RefBase<vk::VkCommandBuffer_s_*> *)local_90);
  (*vk_00->_vptr_DeviceInterface[0x6f])(vk_00,*ppVVar5,(this->m_queryPool).m_internal,1);
  ppVVar5 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      ((RefBase<vk::VkCommandBuffer_s_*> *)local_90);
  (*vk_00->_vptr_DeviceInterface[0x76])(vk_00,*ppVVar5);
  ppVVar5 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      ((RefBase<vk::VkCommandBuffer_s_*> *)local_90);
  pVVar1 = *ppVVar5;
  pIVar6 = de::SharedPtr<vkt::Draw::Image>::operator->
                     (&this->m_stateObjects->m_colorAttachmentImage);
  submitInfo.pSignalSemaphores = (VkSemaphore *)Draw::Image::object(pIVar6);
  Draw::transition2DImage
            (vk_00,pVVar1,(VkImage)submitInfo.pSignalSemaphores,1,VK_IMAGE_LAYOUT_GENERAL,
             VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,0x100,0x800);
  ppVVar5 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      ((RefBase<vk::VkCommandBuffer_s_*> *)local_90);
  (*vk_00->_vptr_DeviceInterface[0x4a])(vk_00,*ppVVar5);
  submitInfo.commandBufferCount = 0;
  submitInfo._44_4_ = 0;
  submitInfo.pCommandBuffers = (VkCommandBuffer *)0x0;
  submitInfo.pWaitSemaphores = (VkSemaphore *)0x0;
  submitInfo.pNext = (void *)0x0;
  submitInfo.waitSemaphoreCount = 0;
  submitInfo._20_4_ = 0;
  submitInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  submitInfo._4_4_ = 0;
  submitInfo.signalSemaphoreCount = 0;
  submitInfo._60_4_ = 0;
  uStack_258 = 4;
  submitInfo.pWaitDstStageMask = (VkPipelineStageFlags *)0x1;
  submitInfo._40_8_ =
       ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::get
                 ((RefBase<vk::VkCommandBuffer_s_*> *)local_90);
  ::vk::Handle<(vk::HandleType)6>::Handle(&local_260,0);
  (*vk_00->_vptr_DeviceInterface[2])(vk_00,pVVar3,1,&uStack_258,local_260.m_internal);
  result = (*vk_00->_vptr_DeviceInterface[3])(vk_00,pVVar3);
  ::vk::checkResult(result,"vk.queueWaitIdle(queue)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/query_pool/vktQueryPoolOcclusionTests.cpp"
                    ,0x1ab);
  queryResultsSize = 0;
  queryResults[0] = 0;
  uStack_280 = 0x10;
  local_290 = (this->m_queryPool).m_internal;
  local_284 = (*vk_00->_vptr_DeviceInterface[0x20])
                        (vk_00,device_00,local_290,0,2,0x10,(int)&queryResultsSize,8,1);
  if (local_284 != VK_NOT_READY) {
    ::vk::checkResult(local_284,"queryResult",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/query_pool/vktQueryPoolOcclusionTests.cpp"
                      ,0x1b7);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2f0,"OcclusionQueryResults",&local_2f1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&ndx,"Occlusion query results",&local_319);
    tcu::LogSection::LogSection(&local_2d0,&local_2f0,(string *)&ndx);
    tcu::TestLog::operator<<(this_03,&local_2d0);
    tcu::LogSection::~LogSection(&local_2d0);
    std::__cxx11::string::~string((string *)&ndx);
    std::allocator<char>::~allocator(&local_319);
    std::__cxx11::string::~string((string *)&local_2f0);
    std::allocator<char>::~allocator(&local_2f1);
    for (local_320 = 0; local_320 < 2; local_320 = local_320 + 1) {
      tcu::TestLog::operator<<
                ((MessageBuilder *)&queryNdx,this_03,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar11 = tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)&queryNdx,(char (*) [16])"query[ slot == ");
      pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_320);
      pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [13])"] result == ");
      pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,queryResults + (long)local_320 + -1);
      tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&queryNdx);
    }
    expectedValue._7_1_ = 1;
    for (expectedValue._0_4_ = 0; (int)expectedValue < 2;
        expectedValue._0_4_ = (int)expectedValue + 1) {
      if ((int)expectedValue == 0) {
        local_4b0 = 0;
      }
      else if ((int)expectedValue == 1) {
        local_4b0 = 3;
      }
      if ((((this->m_testVector).queryControlFlags & 1) == 0) && (local_4b0 != 0)) {
        if (queryResults[(long)(int)expectedValue + -1] == 0) {
          tcu::TestLog::operator<<(&local_7b0,this_03,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar11 = tcu::MessageBuilder::operator<<
                              (&local_7b0,
                               (char (*) [63])
                               "vkGetQueryPoolResults returned wrong value of query for index ");
          pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(int *)&expectedValue);
          pMVar11 = tcu::MessageBuilder::operator<<
                              (pMVar11,(char (*) [36])", expected any non-zero value, got ");
          pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&queryResultsSize);
          pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [2])0x134232e);
          tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_7b0);
          expectedValue._7_1_ = 0;
        }
      }
      else if (queryResults[(long)(int)expectedValue + -1] != local_4b0) {
        tcu::TestLog::operator<<(&local_630,this_03,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar11 = tcu::MessageBuilder::operator<<
                            (&local_630,
                             (char (*) [63])
                             "vkGetQueryPoolResults returned wrong value of query for index ");
        pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(int *)&expectedValue);
        pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [12])0x132bf51);
        pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_4b0);
        pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [7])0x134ad58);
        pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&queryResultsSize);
        pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [2])0x134232e);
        tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_630);
        expectedValue._7_1_ = 0;
      }
    }
    tcu::TestLog::operator<<(this_03,(EndSectionToken *)&tcu::TestLog::EndSection);
    if ((expectedValue._7_1_ & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_7f8,"Query result verification failed",&local_7f9);
      tcu::TestStatus::TestStatus(__return_storage_ptr__,QP_TEST_RESULT_FAIL,&local_7f8);
      std::__cxx11::string::~string((string *)&local_7f8);
      std::allocator<char>::~allocator(&local_7f9);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_7d0,"Query result verification passed",&local_7d1);
      tcu::TestStatus::TestStatus(__return_storage_ptr__,QP_TEST_RESULT_PASS,&local_7d0);
      std::__cxx11::string::~string((string *)&local_7d0);
      std::allocator<char>::~allocator(&local_7d1);
    }
    local_7d8 = 1;
    Draw::RenderPassBeginInfo::~RenderPassBeginInfo((RenderPassBeginInfo *)local_1a0);
    std::vector<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>::~vector
              ((vector<vk::VkClearValue,_std::allocator<vk::VkClearValue>_> *)local_130);
    ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::~Unique
              ((Unique<vk::VkCommandBuffer_s_*> *)local_90);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)24>_>::~Move
              ((Move<vk::Handle<(vk::HandleType)24>_> *)
               &cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool);
    return __return_storage_ptr__;
  }
  this_05 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_05,"Query result not avaliable, but vkWaitIdle() was called.",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/query_pool/vktQueryPoolOcclusionTests.cpp"
             ,0x1b4);
  __cxa_throw(this_05,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

tcu::TestStatus	BasicOcclusionQueryTestInstance::iterate (void)
{
	tcu::TestLog &log				= m_context.getTestContext().getLog();
	const vk::VkDevice device		= m_context.getDevice();
	const vk::VkQueue queue			= m_context.getUniversalQueue();
	const vk::DeviceInterface& vk	= m_context.getDeviceInterface();

	const CmdPoolCreateInfo			cmdPoolCreateInfo	(m_context.getUniversalQueueFamilyIndex());
	vk::Move<vk::VkCommandPool>		cmdPool				= vk::createCommandPool(vk, device, &cmdPoolCreateInfo);

	vk::Unique<vk::VkCommandBuffer> cmdBuffer			(vk::allocateCommandBuffer(vk, device, *cmdPool, vk::VK_COMMAND_BUFFER_LEVEL_PRIMARY));
	const CmdBufferBeginInfo		beginInfo			(0u);

	vk.beginCommandBuffer(*cmdBuffer, &beginInfo);

	transition2DImage(vk, *cmdBuffer, m_stateObjects->m_colorAttachmentImage->object(), vk::VK_IMAGE_ASPECT_COLOR_BIT, vk::VK_IMAGE_LAYOUT_UNDEFINED, vk::VK_IMAGE_LAYOUT_GENERAL, 0, vk::VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT);
	transition2DImage(vk, *cmdBuffer, m_stateObjects->m_DepthImage->object(), vk::VK_IMAGE_ASPECT_DEPTH_BIT, vk::VK_IMAGE_LAYOUT_UNDEFINED, vk::VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL, 0, vk::VK_ACCESS_DEPTH_STENCIL_ATTACHMENT_WRITE_BIT);

	std::vector<vk::VkClearValue> renderPassClearValues(2);
	deMemset(&renderPassClearValues[0], 0, static_cast<int>(renderPassClearValues.size()) * sizeof(vk::VkClearValue));

	const vk::VkRect2D renderArea =
	{
		{ 0,					0 },
		{ StateObjects::WIDTH,	StateObjects::HEIGHT }
	};

	RenderPassBeginInfo renderPassBegin(*m_stateObjects->m_renderPass, *m_stateObjects->m_framebuffer, renderArea, renderPassClearValues);

	vk.cmdResetQueryPool(*cmdBuffer, m_queryPool, 0, NUM_QUERIES_IN_POOL);

	vk.cmdBeginRenderPass(*cmdBuffer, &renderPassBegin, vk::VK_SUBPASS_CONTENTS_INLINE);

	vk.cmdBindPipeline(*cmdBuffer, vk::VK_PIPELINE_BIND_POINT_GRAPHICS, *m_stateObjects->m_pipeline);

	vk::VkBuffer vertexBuffer = m_stateObjects->m_vertexBuffer->object();
	const vk::VkDeviceSize vertexBufferOffset = 0;
	vk.cmdBindVertexBuffers(*cmdBuffer, 0, 1, &vertexBuffer, &vertexBufferOffset);

	vk.cmdBeginQuery(*cmdBuffer, m_queryPool, QUERY_INDEX_CAPTURE_EMPTY, m_testVector.queryControlFlags);
	vk.cmdEndQuery(*cmdBuffer, m_queryPool,	QUERY_INDEX_CAPTURE_EMPTY);

	vk.cmdBeginQuery(*cmdBuffer, m_queryPool, QUERY_INDEX_CAPTURE_DRAWCALL, m_testVector.queryControlFlags);
	vk.cmdDraw(*cmdBuffer, NUM_VERTICES_IN_DRAWCALL, 1, 0, 0);
	vk.cmdEndQuery(*cmdBuffer, m_queryPool,	QUERY_INDEX_CAPTURE_DRAWCALL);

	vk.cmdEndRenderPass(*cmdBuffer);

	transition2DImage(vk, *cmdBuffer, m_stateObjects->m_colorAttachmentImage->object(), vk::VK_IMAGE_ASPECT_COLOR_BIT, vk::VK_IMAGE_LAYOUT_GENERAL, vk::VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL, vk::VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT, vk::VK_ACCESS_TRANSFER_READ_BIT);

	vk.endCommandBuffer(*cmdBuffer);

	// Submit command buffer
	const vk::VkSubmitInfo submitInfo =
	{
		vk::VK_STRUCTURE_TYPE_SUBMIT_INFO,	// VkStructureType			sType;
		DE_NULL,							// const void*				pNext;
		0,									// deUint32					waitSemaphoreCount;
		DE_NULL,							// const VkSemaphore*		pWaitSemaphores;
		(const vk::VkPipelineStageFlags*)DE_NULL,
		1,									// deUint32					commandBufferCount;
		&cmdBuffer.get(),					// const VkCommandBuffer*	pCommandBuffers;
		0,									// deUint32					signalSemaphoreCount;
		DE_NULL								// const VkSemaphore*		pSignalSemaphores;
	};
	vk.queueSubmit(queue, 1, &submitInfo, DE_NULL);

	VK_CHECK(vk.queueWaitIdle(queue));

	deUint64 queryResults[NUM_QUERIES_IN_POOL] = { 0 };
	size_t queryResultsSize		= sizeof(queryResults);

	vk::VkResult queryResult	= vk.getQueryPoolResults(device, m_queryPool, 0, NUM_QUERIES_IN_POOL, queryResultsSize, queryResults, sizeof(queryResults[0]), vk::VK_QUERY_RESULT_64_BIT);

	if (queryResult == vk::VK_NOT_READY)
	{
		TCU_FAIL("Query result not avaliable, but vkWaitIdle() was called.");
	}

	VK_CHECK(queryResult);

	log << tcu::TestLog::Section("OcclusionQueryResults",
		"Occlusion query results");
	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(queryResults); ++ndx)
	{
		log << tcu::TestLog::Message << "query[ slot == " << ndx
			<< "] result == " << queryResults[ndx] << tcu::TestLog::EndMessage;
	}

	bool passed = true;

	for (int queryNdx = 0; queryNdx < DE_LENGTH_OF_ARRAY(queryResults); ++queryNdx)
	{

		deUint64 expectedValue;

		switch (queryNdx)
		{
			case QUERY_INDEX_CAPTURE_EMPTY:
				expectedValue = 0;
				break;
			case QUERY_INDEX_CAPTURE_DRAWCALL:
				expectedValue = NUM_VERTICES_IN_DRAWCALL;
				break;
		}

		if ((m_testVector.queryControlFlags & vk::VK_QUERY_CONTROL_PRECISE_BIT) || expectedValue == 0)
		{
			// require precise value
			if (queryResults[queryNdx] != expectedValue)
			{
				log << tcu::TestLog::Message << "vkGetQueryPoolResults returned "
					"wrong value of query for index "
					<< queryNdx << ", expected " << expectedValue << ", got "
					<< queryResults[0] << "." << tcu::TestLog::EndMessage;
				passed = false;
			}
		}
		else
		{
			// require imprecize value > 0
			if (queryResults[queryNdx] == 0)
			{
				log << tcu::TestLog::Message << "vkGetQueryPoolResults returned "
					"wrong value of query for index "
					<< queryNdx << ", expected any non-zero value, got "
					<< queryResults[0] << "." << tcu::TestLog::EndMessage;
				passed = false;
			}
		}
	}
	log << tcu::TestLog::EndSection;

	if (passed)
	{
		return tcu::TestStatus(QP_TEST_RESULT_PASS, "Query result verification passed");
	}
	return tcu::TestStatus(QP_TEST_RESULT_FAIL, "Query result verification failed");
}